

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O0

void __thiscall
pobr::imgProcessing::structs::Segment::updatePixels
          (Segment *this,Mat_<cv::Vec<int,_3>_> *segmentedImg,int *segmentID)

{
  Vec<int,_3> *this_00;
  int *piVar1;
  Vec<unsigned_char,_3> *pVVar2;
  uchar *puVar3;
  int *thisSegmentID;
  int local_90;
  int y;
  int x;
  Mat_<cv::Vec<unsigned_char,_3>_> local_80;
  int *local_20;
  int *segmentID_local;
  Mat_<cv::Vec<int,_3>_> *segmentedImg_local;
  Segment *this_local;
  
  local_20 = segmentID;
  segmentID_local = (int *)segmentedImg;
  segmentedImg_local = (Mat_<cv::Vec<int,_3>_> *)this;
  cv::Mat_<cv::Vec<unsigned_char,_3>_>::Mat_
            (&local_80,((int)this->yMax - (int)this->yMin) + 1,
             ((int)this->xMax - (int)this->xMin) + 1);
  cv::Mat_<cv::Vec<unsigned_char,_3>_>::operator=(&this->pixels,&local_80);
  cv::Mat_<cv::Vec<unsigned_char,_3>_>::~Mat_(&local_80);
  for (local_90 = 0; (ulong)(long)local_90 < (this->xMax - this->xMin) + 1; local_90 = local_90 + 1)
  {
    for (thisSegmentID._4_4_ = 0; (ulong)(long)thisSegmentID._4_4_ < (this->yMax - this->yMin) + 1;
        thisSegmentID._4_4_ = thisSegmentID._4_4_ + 1) {
      this_00 = cv::Mat_<cv::Vec<int,_3>_>::operator()
                          ((Mat_<cv::Vec<int,_3>_> *)segmentID_local,
                           (int)this->yMin + thisSegmentID._4_4_,(int)this->xMin + local_90);
      piVar1 = cv::Vec<int,_3>::operator[](this_00,0);
      pVVar2 = cv::Mat_<cv::Vec<unsigned_char,_3>_>::operator()
                         (&this->pixels,thisSegmentID._4_4_,local_90);
      puVar3 = cv::Vec<unsigned_char,_3>::operator[](pVVar2,1);
      *puVar3 = '\0';
      pVVar2 = cv::Mat_<cv::Vec<unsigned_char,_3>_>::operator()
                         (&this->pixels,thisSegmentID._4_4_,local_90);
      puVar3 = cv::Vec<unsigned_char,_3>::operator[](pVVar2,2);
      *puVar3 = '\0';
      if (*piVar1 == *local_20) {
        pVVar2 = cv::Mat_<cv::Vec<unsigned_char,_3>_>::operator()
                           (&this->pixels,thisSegmentID._4_4_,local_90);
        puVar3 = cv::Vec<unsigned_char,_3>::operator[](pVVar2,0);
        *puVar3 = 0xff;
      }
      else {
        pVVar2 = cv::Mat_<cv::Vec<unsigned_char,_3>_>::operator()
                           (&this->pixels,thisSegmentID._4_4_,local_90);
        puVar3 = cv::Vec<unsigned_char,_3>::operator[](pVVar2,0);
        *puVar3 = '\0';
      }
    }
  }
  return;
}

Assistant:

const void
Segment::updatePixels(const cv::Mat_<cv::Vec3i>& segmentedImg, const int& segmentID)
{
    this->pixels = cv::Mat_<cv::Vec3b>(
        (this->yMax - this->yMin + 1),
        (this->xMax - this->xMin + 1)
    );

    for (int x = 0; x < (this->xMax - this->xMin + 1); x++) {
        for (int y = 0; y < (this->yMax - this->yMin + 1); y++) {
            auto& thisSegmentID = segmentedImg(this->yMin + y, this->xMin + x)[0];

            this->pixels(y, x)[1] = consts::colors::black;
            this->pixels(y, x)[2] = consts::colors::black;

            if (thisSegmentID != segmentID) {
                this->pixels(y, x)[0] = consts::colors::black;
            } else {
                this->pixels(y, x)[0] = consts::colors::white;
            }
        }
    }
}